

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::OpenOutputFile
          (cmCTest *this,string *path,string *name,cmGeneratedFileStream *stream,
          bool cm_zlib_compress)

{
  bool bVar1;
  byte bVar2;
  pointer pPVar3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_5c8 [32];
  undefined1 local_5a8 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_429;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  string filename;
  undefined1 local_3a8 [8];
  ostringstream cmCTestLog_msg_1;
  Status local_22c;
  undefined4 local_224;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string testingDir;
  bool cm_zlib_compress_local;
  cmGeneratedFileStream *stream_local;
  string *name_local;
  string *path_local;
  cmCTest *this_local;
  
  testingDir.field_2._M_local_buf[0xf] = cm_zlib_compress;
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &pPVar3->BinaryDir,"/Testing");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator+(&local_78,"/",path);
    std::__cxx11::string::operator+=((string *)local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = cmsys::SystemTools::FileExists((string *)local_58);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_58);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      poVar5 = std::operator<<((ostream *)local_200,"File ");
      poVar5 = std::operator<<(poVar5,(string *)local_58);
      poVar5 = std::operator<<(poVar5," is in the place of the testing directory");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x342,pcVar6,false);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      this_local._7_1_ = false;
      local_224 = 1;
      goto LAB_0095bfbe;
    }
  }
  else {
    local_22c = cmsys::SystemTools::MakeDirectory((string *)local_58,(mode_t *)0x0);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_22c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar5 = std::operator<<((ostream *)local_3a8,"Cannot create directory ");
      poVar5 = std::operator<<(poVar5,(string *)local_58);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x348,pcVar6,false);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
      this_local._7_1_ = false;
      local_224 = 1;
      goto LAB_0095bfbe;
    }
  }
  std::operator+(&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                 &local_408,name);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"tmp",&local_429);
  cmGeneratedFileStream::SetTempExt(stream,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  cmGeneratedFileStream::Open(stream,(string *)local_3e8,false,false);
  bVar2 = std::ios::operator!((ios *)((long)&(stream->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(stream->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if ((bVar2 & 1) == 0) {
    if (((testingDir.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl), (pPVar3->CompressXMLFiles & 1U) != 0)) {
      cmGeneratedFileStream::SetCompression(stream,true);
    }
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
    poVar5 = std::operator<<((ostream *)local_5a8,"Problem opening file: ");
    poVar5 = std::operator<<(poVar5,(string *)local_3e8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x351,pcVar6,false);
    std::__cxx11::string::~string(local_5c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
    this_local._7_1_ = false;
  }
  local_224 = 1;
  std::__cxx11::string::~string((string *)local_3e8);
LAB_0095bfbe:
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmCTest::OpenOutputFile(const std::string& path, const std::string& name,
                             cmGeneratedFileStream& stream, bool compress)
{
  std::string testingDir = this->Impl->BinaryDir + "/Testing";
  if (!path.empty()) {
    testingDir += "/" + path;
  }
  if (cmSystemTools::FileExists(testingDir)) {
    if (!cmSystemTools::FileIsDirectory(testingDir)) {
      cmCTestLog(this, ERROR_MESSAGE,
                 "File " << testingDir
                         << " is in the place of the testing directory"
                         << std::endl);
      return false;
    }
  } else {
    if (!cmSystemTools::MakeDirectory(testingDir)) {
      cmCTestLog(this, ERROR_MESSAGE,
                 "Cannot create directory " << testingDir << std::endl);
      return false;
    }
  }
  std::string filename = testingDir + "/" + name;
  stream.SetTempExt("tmp");
  stream.Open(filename);
  if (!stream) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Problem opening file: " << filename << std::endl);
    return false;
  }
  if (compress) {
    if (this->Impl->CompressXMLFiles) {
      stream.SetCompression(true);
    }
  }
  return true;
}